

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffuselight.hpp
# Opt level: O1

Color __thiscall
DiffuseLight::sampleIrradiance
          (DiffuseLight *this,point *surface,vec3f *dirToLight,float *dist,Sampler *sampler)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  float fVar4;
  float fVar5;
  float fVar6;
  Color CVar7;
  SampleInfo info;
  float local_68;
  float fStack_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_48;
  float fStack_44;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  
  (*this->base->_vptr_Primitive[2])(&local_68,this->base,sampler);
  fVar5 = local_68 - surface->x;
  fVar6 = fStack_64 - surface->y;
  fVar4 = local_60 - surface->z;
  fVar4 = fVar4 * fVar4 + fVar5 * fVar5 + fVar6 * fVar6;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  *dist = fVar4;
  local_38._0_4_ = local_60 - surface->z;
  uVar1 = surface->x;
  uVar3 = surface->y;
  local_48 = local_68 - (float)uVar1;
  fStack_44 = fStack_64 - (float)uVar3;
  fVar4 = (float)local_38._0_4_ * (float)local_38._0_4_ +
          local_48 * local_48 + fStack_44 * fStack_44;
  if (fVar4 < 0.0) {
    local_38 = ZEXT416((uint)local_38._0_4_);
    uStack_40 = 0;
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar4 = 1.0 / fVar4;
  dirToLight->x = local_48 * fVar4;
  dirToLight->y = fStack_44 * fVar4;
  dirToLight->z = (float)local_38._0_4_ * fVar4;
  local_68 = local_68 - surface->x;
  fStack_64 = fStack_64 - surface->y;
  local_60 = local_60 - surface->z;
  local_50 = (((float)local_38._0_4_ * fVar4 * local_54 +
              local_5c * dirToLight->x + local_58 * dirToLight->y) /
             (local_60 * local_60 + local_68 * local_68 + fStack_64 * fStack_64)) / local_50;
  if (this->sampleside == 0) {
    local_50 = ABS(local_50);
  }
  else {
    local_50 = local_50 * (float)this->sampleside;
    if (local_50 <= 0.0) {
      local_50 = 0.0;
    }
  }
  uVar2 = *(undefined8 *)&(this->super_Light).field_0xc;
  CVar7.x = local_50 * (float)uVar2;
  CVar7.y = local_50 * (float)((ulong)uVar2 >> 0x20);
  CVar7.z = local_50 * *(float *)&this->field_0x14;
  return CVar7;
}

Assistant:

Color sampleIrradiance(const point& surface, vec3f& dirToLight, float& dist, Sampler& sampler) const
	{
		assert(samplable);
		auto info = base->sampleSurface(sampler);
		dist = norm(info.p - surface);
		dirToLight = normalized(info.p - surface);
		float t = dot(info.normal, dirToLight) / sqrlen(info.p - surface) / info.pdf;
		t = sampleside? fmax(t*sampleside, 0): fabs(t);
		return t * _radiance;
	}